

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool __thiscall ghc::filesystem::path::has_filename(path *this)

{
  bool bVar1;
  path local_38;
  
  bVar1 = has_relative_path(this);
  if (bVar1) {
    filename(&local_38,this);
    bVar1 = local_38._path._M_string_length != 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._path._M_dataplus._M_p != &local_38._path.field_2) {
      operator_delete(local_38._path._M_dataplus._M_p,
                      local_38._path.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

GHC_INLINE bool path::has_filename() const
{
    return has_relative_path() && !filename().empty();
}